

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::AggressiveDCEPass::GetLoadedVariablesFromFunctionCall
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          AggressiveDCEPass *this,Instruction *inst)

{
  pointer pOVar1;
  uint **ppuVar2;
  bool bVar3;
  char cVar4;
  uint **ppuVar5;
  pointer pOVar6;
  AggressiveDCEPass **local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  uint *local_50;
  AggressiveDCEPass *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_40;
  code *local_38;
  code *pcStack_30;
  
  if (inst->opcode_ != OpFunctionCall) {
    __assert_fail("inst->opcode() == spv::Op::OpFunctionCall",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp"
                  ,0x1d3,
                  "std::vector<uint32_t> spvtools::opt::AggressiveDCEPass::GetLoadedVariablesFromFunctionCall(const Instruction *)"
                 );
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = &local_48;
  pcStack_30 = std::
               _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:472:21)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:472:21)>
             ::_M_manager;
  uStack_70 = 0;
  pcStack_60 = std::
               _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:838:17)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:838:17)>
             ::_M_manager;
  pOVar6 = (inst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (inst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_48 = this;
  pvStack_40 = __return_storage_ptr__;
  if (pOVar6 != pOVar1) {
    do {
      bVar3 = spvIsInIdType(pOVar6->type);
      if (bVar3) {
        ppuVar2 = (uint **)(pOVar6->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        ppuVar5 = &(pOVar6->words).small_data_;
        if (ppuVar2 != (uint **)0x0) {
          ppuVar5 = ppuVar2;
        }
        local_50 = *ppuVar5;
        if (local_68 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        cVar4 = (*pcStack_60)(&local_78,&local_50);
        if (cVar4 == '\0') break;
      }
      pOVar6 = pOVar6 + 1;
    } while (pOVar6 != pOVar1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> AggressiveDCEPass::GetLoadedVariablesFromFunctionCall(
    const Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpFunctionCall);
  std::vector<uint32_t> live_variables;
  // NOTE: we should only be checking function call parameters here, not the
  // function itself, however, `IsPtr` will trivially return false for
  // OpFunction
  inst->ForEachInId([this, &live_variables](const uint32_t* operand_id) {
    if (!IsPtr(*operand_id)) return;
    uint32_t var_id = GetVariableId(*operand_id);
    live_variables.push_back(var_id);
  });
  return live_variables;
}